

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

ssize_t duckdb_je_arena_muzzy_decay_ms_default_get(void)

{
  ssize_t result;
  
  return muzzy_decay_ms_default.repr;
}

Assistant:

ssize_t
arena_muzzy_decay_ms_default_get(void) {
	return atomic_load_zd(&muzzy_decay_ms_default, ATOMIC_RELAXED);
}